

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testMiscMatrixAlgo.cpp
# Opt level: O0

void anon_unknown.dwarf_6334f::testComputeRSMatrix(void)

{
  M44f ArBsA;
  M44f ArAsB;
  M44f ArBsB;
  M44f ArAsA;
  M44f B;
  M44f A;
  V3f scaleB;
  V3f scaleA;
  V3f rotB;
  V3f rotA;
  V3f transB;
  V3f transA;
  int i;
  Rand48 random;
  unsigned_long in_stack_fffffffffffffe28;
  Rand48 *in_stack_fffffffffffffe30;
  V3f *in_stack_fffffffffffffe68;
  V3f *in_stack_fffffffffffffe70;
  V3f *in_stack_fffffffffffffe78;
  M44f *in_stack_fffffffffffffe80;
  V3f *in_stack_fffffffffffffe90;
  V3f *in_stack_fffffffffffffe98;
  V3f *in_stack_fffffffffffffea0;
  undefined6 in_stack_fffffffffffffea8;
  undefined1 in_stack_fffffffffffffeae;
  undefined1 in_stack_fffffffffffffeaf;
  Vec3<float> local_54;
  Vec3<float> local_48;
  Vec3<float> local_3c;
  Vec3<float> local_30;
  Vec3<float> local_24;
  Vec3<float> local_18;
  int local_c;
  
  Imath_2_5::Rand48::Rand48(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
  for (local_c = 0; local_c < 100000; local_c = local_c + 1) {
    Imath_2_5::Vec3<float>::Vec3(&local_18);
    Imath_2_5::Vec3<float>::Vec3(&local_24);
    Imath_2_5::Vec3<float>::Vec3(&local_30);
    Imath_2_5::Vec3<float>::Vec3(&local_3c);
    Imath_2_5::Vec3<float>::Vec3(&local_48);
    Imath_2_5::Vec3<float>::Vec3(&local_54);
    createRandomMat((Rand48 *)
                    CONCAT17(in_stack_fffffffffffffeaf,
                             CONCAT16(in_stack_fffffffffffffeae,in_stack_fffffffffffffea8)),
                    in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
    createRandomMat((Rand48 *)
                    CONCAT17(in_stack_fffffffffffffeaf,
                             CONCAT16(in_stack_fffffffffffffeae,in_stack_fffffffffffffea8)),
                    in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
    Imath_2_5::computeRSMatrix<float>
              ((bool)in_stack_fffffffffffffeaf,(bool)in_stack_fffffffffffffeae,
               (Matrix44<float> *)in_stack_fffffffffffffea0,
               (Matrix44<float> *)in_stack_fffffffffffffe98);
    Imath_2_5::computeRSMatrix<float>
              ((bool)in_stack_fffffffffffffeaf,(bool)in_stack_fffffffffffffeae,
               (Matrix44<float> *)in_stack_fffffffffffffea0,
               (Matrix44<float> *)in_stack_fffffffffffffe98);
    Imath_2_5::computeRSMatrix<float>
              ((bool)in_stack_fffffffffffffeaf,(bool)in_stack_fffffffffffffeae,
               (Matrix44<float> *)in_stack_fffffffffffffea0,
               (Matrix44<float> *)in_stack_fffffffffffffe98);
    Imath_2_5::computeRSMatrix<float>
              ((bool)in_stack_fffffffffffffeaf,(bool)in_stack_fffffffffffffeae,
               (Matrix44<float> *)in_stack_fffffffffffffea0,
               (Matrix44<float> *)in_stack_fffffffffffffe98);
    testRSMatrix(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,in_stack_fffffffffffffe70,
                 in_stack_fffffffffffffe68);
    testRSMatrix(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,in_stack_fffffffffffffe70,
                 in_stack_fffffffffffffe68);
    testRSMatrix(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,in_stack_fffffffffffffe70,
                 in_stack_fffffffffffffe68);
    testRSMatrix(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,in_stack_fffffffffffffe70,
                 in_stack_fffffffffffffe68);
  }
  return;
}

Assistant:

void
testComputeRSMatrix ()
{
    Rand48 random(0);
    
    for (int i = 0; i < 100000; ++i)
    {
        debug (("iteration: %d\n", i));

        V3f transA, transB, rotA, rotB, scaleA, scaleB;
        
        M44f A = createRandomMat(random, transA, rotA, scaleA);
        M44f B = createRandomMat(random, transB, rotB, scaleB);

        M44f ArAsA = computeRSMatrix( true,  true,  A, B);
        M44f ArBsB = computeRSMatrix( false, false, A, B);
        M44f ArAsB = computeRSMatrix( true,  false, A, B);
        M44f ArBsA = computeRSMatrix( false, true,  A, B);
        
        testRSMatrix(ArAsA, transA, rotA, scaleA);
        testRSMatrix(ArBsB, transA, rotB, scaleB);
        testRSMatrix(ArAsB, transA, rotA, scaleB);
        testRSMatrix(ArBsA, transA, rotB, scaleA);

        debug (("\n"));
    }
}